

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  undefined8 uVar1;
  int iVar2;
  void *__ptr;
  uchar **__ptr_00;
  uchar *__src;
  uchar *puVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int *in_R9;
  int i;
  int est;
  int best_filter_val;
  int best_filter;
  int filter_type;
  int zlen;
  int j;
  char *line_buffer;
  uchar *zlib;
  uchar *filt;
  uchar *o;
  uchar *out;
  uchar sig [8];
  int ctype [5];
  int force_filter;
  int in_stack_ffffffffffffff5c;
  uchar **in_stack_ffffffffffffff60;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined4 local_48;
  int iVar4;
  undefined8 uVar5;
  int height;
  int width;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  uchar *local_8;
  
  _local_48 = 0xffffffff;
  uVar5 = 0x200000004;
  width = 6;
  if (in_ESI == 0) {
    in_ESI = in_EDX * in_R8D;
  }
  local_84 = stbi_write_force_png_filter;
  if (4 < stbi_write_force_png_filter) {
    local_84 = -1;
  }
  __ptr = malloc((long)((in_EDX * in_R8D + 1) * in_ECX));
  if (__ptr == (void *)0x0) {
    local_8 = (uchar *)0x0;
  }
  else {
    __ptr_00 = (uchar **)malloc((long)(in_EDX * in_R8D));
    if (__ptr_00 == (uchar **)0x0) {
      free(__ptr);
      local_8 = (uchar *)0x0;
    }
    else {
      for (local_7c = 0; uVar1 = _local_48, local_7c < in_ECX; local_7c = local_7c + 1) {
        iVar6 = local_84;
        if (local_84 < 0) {
          local_88 = 0;
          local_8c = 0x7fffffff;
          local_84 = 0;
          while( true ) {
            uVar1 = _local_48;
            iVar4 = (int)((ulong)_local_48 >> 0x20);
            iVar2 = iVar4;
            height = (int)((ulong)uVar5 >> 0x20);
            _local_48 = uVar1;
            if (4 < local_84) break;
            in_stack_ffffffffffffff60 = __ptr_00;
            stbiw__encode_png_line
                      ((uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                       width,height,(int)uVar5,iVar2,in_R8D,(char *)CONCAT44(in_ESI,in_EDX));
            local_90 = 0;
            for (local_94 = 0; local_94 < in_EDX * in_R8D; local_94 = local_94 + 1) {
              iVar2 = (int)*(char *)((long)__ptr_00 + (long)local_94);
              if (iVar2 < 1) {
                iVar2 = -iVar2;
              }
              local_90 = iVar2 + local_90;
            }
            if (local_90 < local_8c) {
              local_8c = local_90;
              local_88 = local_84;
            }
            local_84 = local_84 + 1;
          }
          if (local_84 != local_88) {
            in_stack_ffffffffffffff60 = __ptr_00;
            stbiw__encode_png_line
                      ((uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                       width,height,(int)uVar5,iVar2,in_R8D,(char *)CONCAT44(in_ESI,in_EDX));
            local_84 = local_88;
          }
        }
        else {
          iVar4 = (int)((ulong)_local_48 >> 0x20);
          iVar2 = iVar4;
          in_stack_ffffffffffffff60 = __ptr_00;
          _local_48 = uVar1;
          stbiw__encode_png_line
                    ((uchar *)CONCAT44(local_84,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
                     ,width,(int)((ulong)uVar5 >> 0x20),(int)uVar5,iVar2,in_R8D,
                     (char *)CONCAT44(in_ESI,in_EDX));
        }
        *(char *)((long)__ptr + (long)(local_7c * (in_EDX * in_R8D + 1))) = (char)local_84;
        memmove((void *)((long)__ptr + (long)(local_7c * (in_EDX * in_R8D + 1)) + 1),__ptr_00,
                (long)(in_EDX * in_R8D));
        local_84 = iVar6;
      }
      free(__ptr_00);
      __src = stbi_zlib_compress((uchar *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R9,local_84);
      free(__ptr);
      if (__src == (uchar *)0x0) {
        local_8 = (uchar *)0x0;
      }
      else {
        local_8 = (uchar *)malloc((long)(local_80 + 0x39));
        if (local_8 == (uchar *)0x0) {
          local_8 = (uchar *)0x0;
        }
        else {
          *in_R9 = local_80 + 0x39;
          local_8[0] = 0x89;
          local_8[1] = 'P';
          local_8[2] = 'N';
          local_8[3] = 'G';
          local_8[4] = '\r';
          local_8[5] = '\n';
          local_8[6] = '\x1a';
          local_8[7] = '\n';
          local_8[8] = '\0';
          local_8[9] = '\0';
          local_8[10] = '\0';
          local_8[0xb] = '\r';
          local_8[0xc] = 'I';
          local_8[0xd] = 'H';
          local_8[0xe] = 'D';
          local_8[0xf] = 'R';
          local_8[0x10] = (uchar)((uint)in_EDX >> 0x18);
          local_8[0x11] = (uchar)((uint)in_EDX >> 0x10);
          local_8[0x12] = (uchar)((uint)in_EDX >> 8);
          local_8[0x13] = (uchar)in_EDX;
          local_8[0x14] = (uchar)((uint)in_ECX >> 0x18);
          local_8[0x15] = (uchar)((uint)in_ECX >> 0x10);
          local_8[0x16] = (uchar)((uint)in_ECX >> 8);
          local_8[0x17] = (uchar)in_ECX;
          local_8[0x18] = '\b';
          local_8[0x19] = (uchar)(&local_48)[in_R8D];
          local_8[0x1a] = '\0';
          local_8[0x1b] = '\0';
          local_8[0x1c] = '\0';
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          local_8[0x1d] = (uchar)((uint)local_80 >> 0x18);
          local_8[0x1e] = (uchar)((uint)local_80 >> 0x10);
          local_8[0x1f] = (uchar)((uint)local_80 >> 8);
          local_8[0x20] = (uchar)local_80;
          local_8[0x21] = 'I';
          local_8[0x22] = 'D';
          local_8[0x23] = 'A';
          local_8[0x24] = 'T';
          memmove(local_8 + 0x25,__src,(long)local_80);
          puVar3 = local_8 + 0x25 + local_80;
          free(__src);
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          *puVar3 = '\0';
          puVar3[1] = '\0';
          puVar3[2] = '\0';
          puVar3[3] = '\0';
          puVar3[4] = 'I';
          puVar3[5] = 'E';
          puVar3[6] = 'N';
          puVar3[7] = 'D';
          stbiw__wpcrc(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        }
      }
    }
  }
  return local_8;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}